

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.hpp
# Opt level: O0

SubcaseBasePtr deqp::TestSubcase::Create<glcts::(anonymous_namespace)::AdvancedResourcesMax>(void)

{
  AdvancedResourcesMax *this;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<deqp::SubcaseBase> *in_RDI;
  SubcaseBasePtr SVar1;
  
  this = (AdvancedResourcesMax *)operator_new(0x90);
  this->m_uniform_buffer[9] = 0;
  this->m_uniform_buffer[10] = 0;
  *(undefined8 *)(this->m_uniform_buffer + 0xb) = 0;
  this->m_uniform_buffer[5] = 0;
  this->m_uniform_buffer[6] = 0;
  this->m_uniform_buffer[7] = 0;
  this->m_uniform_buffer[8] = 0;
  this->m_uniform_buffer[1] = 0;
  this->m_uniform_buffer[2] = 0;
  this->m_uniform_buffer[3] = 0;
  this->m_uniform_buffer[4] = 0;
  this->m_storage_buffer[1] = 0;
  this->m_storage_buffer[2] = 0;
  *(undefined8 *)(this->m_storage_buffer + 3) = 0;
  (this->super_ComputeShaderBase).g_color_eps.m_data[2] = 0.0;
  (this->super_ComputeShaderBase).g_color_eps.m_data[3] = 0.0;
  this->m_program = 0;
  this->m_storage_buffer[0] = 0;
  (this->super_ComputeShaderBase).pixelFormat = (PixelFormat *)0x0;
  (this->super_ComputeShaderBase).g_color_eps.m_data[0] = 0.0;
  (this->super_ComputeShaderBase).g_color_eps.m_data[1] = 0.0;
  (this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.m_context = (Context *)0x0;
  (this->super_ComputeShaderBase).renderTarget = (RenderTarget *)0x0;
  (this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper.m_log =
       (TestLog *)0x0;
  *(undefined8 *)
   &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper.
    m_enableLog = 0;
  (this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper =
       (_func_int **)0x0;
  (this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper.m_gl =
       (Functions *)0x0;
  glcts::anon_unknown_0::AdvancedResourcesMax::AdvancedResourcesMax(this);
  de::SharedPtr<deqp::SubcaseBase>::SharedPtr(in_RDI,(SubcaseBase *)this);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (SubcaseBase *)in_RDI;
  return SVar1;
}

Assistant:

static SubcaseBase::SubcaseBasePtr Create()
	{
		return SubcaseBase::SubcaseBasePtr(new Type());
	}